

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_initDStream_usingDDict(ZSTD_DStream *dctx,ZSTD_DDict *ddict)

{
  size_t sVar1;
  
  dctx->streamStage = zdss_init;
  dctx->noForwardProgress = 0;
  dctx->isFrameDecompression = 1;
  sVar1 = ZSTD_DCtx_refDDict(dctx,ddict);
  if (sVar1 < 0xffffffffffffff89) {
    sVar1 = (ulong)(dctx->format == ZSTD_f_zstd1) * 4 + 1;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_initDStream_usingDDict(ZSTD_DStream* dctx, const ZSTD_DDict* ddict)
{
    DEBUGLOG(4, "ZSTD_initDStream_usingDDict");
    FORWARD_IF_ERROR( ZSTD_DCtx_reset(dctx, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_DCtx_refDDict(dctx, ddict) , "");
    return ZSTD_startingInputLength(dctx->format);
}